

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O0

IntBone_MDL7 ** __thiscall Assimp::MDLImporter::LoadBones_3DGS_MDL7(MDLImporter *this)

{
  uchar *puVar1;
  Logger *this_00;
  ulong uVar2;
  IntBone_MDL7 *this_01;
  uint local_2c;
  uint32_t crank;
  IntBone_MDL7 **apcBonesOut;
  Header_MDL7 *pcHeader;
  MDLImporter *this_local;
  
  puVar1 = this->mBuffer;
  if (*(int *)(puVar1 + 8) == 0) {
    this_local = (MDLImporter *)0x0;
  }
  else if (((*(short *)(puVar1 + 0x1c) == 0x24) || (*(short *)(puVar1 + 0x1c) == 0x30)) ||
          (*(short *)(puVar1 + 0x1c) == 0x10)) {
    uVar2 = SUB168(ZEXT416(*(uint *)(puVar1 + 8)) * ZEXT816(8),0);
    if (SUB168(ZEXT416(*(uint *)(puVar1 + 8)) * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    this_local = (MDLImporter *)operator_new__(uVar2);
    for (local_2c = 0; local_2c < *(uint *)(puVar1 + 8); local_2c = local_2c + 1) {
      this_01 = (IntBone_MDL7 *)operator_new(0x4b0);
      MDL::IntBone_MDL7::IntBone_MDL7(this_01);
      (&(this_local->super_BaseImporter)._vptr_BaseImporter)[local_2c] = (_func_int **)this_01;
    }
    CalcAbsBoneMatrices_3DGS_MDL7(this,(IntBone_MDL7 **)this_local);
  }
  else {
    this_00 = DefaultLogger::get();
    Logger::warn(this_00,"Unknown size of bone data structure");
    this_local = (MDLImporter *)0x0;
  }
  return (IntBone_MDL7 **)this_local;
}

Assistant:

MDL::IntBone_MDL7** MDLImporter::LoadBones_3DGS_MDL7()
{
  const MDL::Header_MDL7 *pcHeader = (const MDL::Header_MDL7*)this->mBuffer;
    if (pcHeader->bones_num)    {
        // validate the size of the bone data structure in the file
        if (AI_MDL7_BONE_STRUCT_SIZE__NAME_IS_20_CHARS  != pcHeader->bone_stc_size &&
            AI_MDL7_BONE_STRUCT_SIZE__NAME_IS_32_CHARS  != pcHeader->bone_stc_size &&
            AI_MDL7_BONE_STRUCT_SIZE__NAME_IS_NOT_THERE != pcHeader->bone_stc_size)
        {
            ASSIMP_LOG_WARN("Unknown size of bone data structure");
            return NULL;
        }

        MDL::IntBone_MDL7** apcBonesOut = new MDL::IntBone_MDL7*[pcHeader->bones_num];
        for (uint32_t crank = 0; crank < pcHeader->bones_num;++crank)
            apcBonesOut[crank] = new MDL::IntBone_MDL7();

        // and calculate absolute bone offset matrices ...
        CalcAbsBoneMatrices_3DGS_MDL7(apcBonesOut);
        return apcBonesOut;
    }
    return NULL;
}